

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_cookies.cpp
# Opt level: O0

void __thiscall
cppcms::sessions::session_cookies::save
          (session_cookies *this,session_interface *session,string *data,time_t timeout,bool param_5
          ,bool on_server)

{
  undefined8 uVar1;
  pointer peVar2;
  string *in_RDX;
  byte in_R8B;
  byte in_R9B;
  string cdata;
  string cipher;
  string real_data;
  string *in_stack_fffffffffffffed8;
  cppcms_error *in_stack_fffffffffffffee0;
  session_interface *this_00;
  char *in_stack_fffffffffffffee8;
  string local_e0 [32];
  string local_c0 [24];
  string *in_stack_ffffffffffffff58;
  string local_a0 [32];
  undefined1 local_80 [56];
  string local_48 [38];
  byte local_22;
  byte local_21;
  undefined1 local_20 [8];
  string *local_18;
  
  local_21 = in_R8B & 1;
  local_22 = in_R9B & 1;
  if (local_22 != 0) {
    local_80[0x23] = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_48,"Can\'t use cookies backend when data should be stored on server",
               (allocator *)(local_80 + 0x37));
    cppcms_error::cppcms_error(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    local_80[0x23] = 0;
    __cxa_throw(uVar1,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
  }
  this_00 = (session_interface *)local_80;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)this_00);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)this_00);
  std::__cxx11::string::append(local_80,(ulong)local_20);
  std::__cxx11::string::operator+=((string *)local_80,local_18);
  peVar2 = std::
           unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
           ::operator->((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                         *)0x43cc6a);
  (**peVar2->_vptr_encryptor)(local_a0,peVar2,local_80);
  b64url::encode(in_stack_ffffffffffffff58);
  std::operator+(in_stack_fffffffffffffee8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string(local_e0);
  session_interface::set_session_cookie(this_00,in_stack_fffffffffffffed8);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string((string *)local_80);
  return;
}

Assistant:

void session_cookies::save(session_interface &session,string const &data,time_t timeout,bool /*not_used*/,bool on_server)
{
	if(on_server)
		throw cppcms_error("Can't use cookies backend when data should be stored on server");
	std::string real_data;
	real_data.reserve(data.size() + sizeof(timeout));
	real_data.append(reinterpret_cast<char *>(&timeout),sizeof(timeout));
	real_data+=data;
	std::string cipher = encryptor_->encrypt(real_data);
	string cdata="C" + b64url::encode(cipher);
	session.set_session_cookie(cdata);
}